

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O0

void __thiscall
Diligent::TextureBaseGL::TextureBaseGL
          (TextureBaseGL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          TextureDesc *TexDesc,GLenum BindTarget,TextureData *pInitData,bool bIsDeviceInternal)

{
  USAGE UVar1;
  TextureDesc *this_00;
  bool bVar2;
  GLenum GVar3;
  Char *pCVar4;
  char (*Args_1) [7];
  undefined1 local_f0 [8];
  string msg_1;
  allocator local_b9;
  string local_b8 [8];
  string StagingBuffName;
  BufferDesc StagingBufferDesc;
  string msg;
  GLTextureCreateReleaseHelper local_3c;
  undefined1 local_35;
  GLenum local_34;
  bool bIsDeviceInternal_local;
  TextureDesc *pTStack_30;
  GLenum BindTarget_local;
  TextureDesc *TexDesc_local;
  RenderDeviceGLImpl *pDeviceGL_local;
  FixedBlockMemoryAllocator *TexViewObjAllocator_local;
  IReferenceCounters *pRefCounters_local;
  TextureBaseGL *this_local;
  
  local_35 = bIsDeviceInternal;
  local_34 = BindTarget;
  pTStack_30 = TexDesc;
  TexDesc_local = (TextureDesc *)pDeviceGL;
  pDeviceGL_local = (RenderDeviceGLImpl *)TexViewObjAllocator;
  TexViewObjAllocator_local = (FixedBlockMemoryAllocator *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  TextureBase<Diligent::EngineGLImplTraits>::TextureBase
            (&this->super_TextureBase<Diligent::EngineGLImplTraits>,pRefCounters,TexViewObjAllocator
             ,pDeviceGL,TexDesc,bIsDeviceInternal);
  AsyncWritableResource::AsyncWritableResource(&this->super_AsyncWritableResource);
  (this->super_TextureBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00592fe8;
  UVar1 = pTStack_30->Usage;
  GLObjectWrappers::GLTextureCreateReleaseHelper::GLTextureCreateReleaseHelper(&local_3c,0);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
            (&this->m_GlTexture,UVar1 != USAGE_STAGING,local_3c);
  RefCntAutoPtr<Diligent::IBuffer>::RefCntAutoPtr(&this->m_pPBO);
  this->m_BindTarget = local_34;
  GVar3 = TexFormatToGLInternalTexFormat
                    ((this->super_TextureBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                     .m_Desc.Format,
                     (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                     .m_Desc.BindFlags);
  this->m_GLTexFormat = GVar3;
  if (this->m_GLTexFormat == 0) {
    FormatString<char[27]>
              ((string *)&StagingBufferDesc.ImmediateContextMask,
               (char (*) [27])"Unsupported texture format");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"TextureBaseGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x42);
    std::__cxx11::string::~string((string *)&StagingBufferDesc.ImmediateContextMask);
  }
  if ((pTStack_30->Usage == USAGE_IMMUTABLE) && (pInitData == (TextureData *)0x0)) {
    LogError<true,char[66]>
              (false,"TextureBaseGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x44,(char (*) [66])
                     "Immutable textures must be initialized with data at creation time");
  }
  if (pTStack_30->Usage == USAGE_STAGING) {
    BufferDesc::BufferDesc((BufferDesc *)((long)&StagingBuffName.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Internal staging buffer of texture \'",&local_b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::operator+=
              (local_b8,(this->super_TextureBase<Diligent::EngineGLImplTraits>).
                        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                        .m_Desc.super_DeviceObjectAttribs.Name);
    std::__cxx11::string::operator+=(local_b8,'\'');
    StagingBuffName.field_2._8_8_ = std::__cxx11::string::c_str();
    StagingBufferDesc.super_DeviceObjectAttribs.Name =
         (Char *)GetStagingTextureDataSize
                           (&(this->super_TextureBase<Diligent::EngineGLImplTraits>).
                             super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                             .m_Desc,4);
    this_00 = TexDesc_local;
    StagingBufferDesc.Size._4_1_ = 3;
    StagingBufferDesc.Size._5_1_ = pTStack_30->CPUAccessFlags;
    RefCntAutoPtr<Diligent::IBuffer>::operator&
              ((RefCntAutoPtr<Diligent::IBuffer> *)((long)&msg_1.field_2 + 8));
    Args_1 = (char (*) [7])
             Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_IBuffer__
                       ((DoublePtrHelper *)(msg_1.field_2._M_local_buf + 8));
    RenderDeviceGLImpl::CreateBuffer
              ((RenderDeviceGLImpl *)this_00,(BufferDesc *)((long)&StagingBuffName.field_2 + 8),
               (BufferData *)0x0,(IBuffer **)Args_1);
    RefCntAutoPtr<Diligent::IBuffer>::DoublePtrHelper<Diligent::IBuffer>::~DoublePtrHelper
              ((DoublePtrHelper<Diligent::IBuffer> *)((long)&msg_1.field_2 + 8));
    bVar2 = RefCntAutoPtr<Diligent::IBuffer>::operator!(&this->m_pPBO);
    if (bVar2) {
      FormatString<char[26],char[7]>
                ((string *)local_f0,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pPBO"
                 ,Args_1);
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"TextureBaseGL",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x53);
      std::__cxx11::string::~string((string *)local_f0);
    }
    std::__cxx11::string::~string(local_b8);
  }
  return;
}

Assistant:

TextureBaseGL::TextureBaseGL(IReferenceCounters*        pRefCounters,
                             FixedBlockMemoryAllocator& TexViewObjAllocator,
                             RenderDeviceGLImpl*        pDeviceGL,
                             const TextureDesc&         TexDesc,
                             GLenum                     BindTarget,
                             const TextureData*         pInitData /*= nullptr*/,
                             bool                       bIsDeviceInternal /*= false*/) :
    // clang-format off
    TTextureBase
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        TexDesc,
        bIsDeviceInternal
    },
    m_GlTexture     {TexDesc.Usage != USAGE_STAGING},
    m_BindTarget    {BindTarget },
    m_GLTexFormat   {TexFormatToGLInternalTexFormat(m_Desc.Format, m_Desc.BindFlags)}
    //m_uiMapTarget(0)
// clang-format on
{
    VERIFY(m_GLTexFormat != 0, "Unsupported texture format");
    if (TexDesc.Usage == USAGE_IMMUTABLE && pInitData == nullptr)
        LOG_ERROR_AND_THROW("Immutable textures must be initialized with data at creation time");

    if (TexDesc.Usage == USAGE_STAGING)
    {
        BufferDesc  StagingBufferDesc;
        std::string StagingBuffName = "Internal staging buffer of texture '";
        StagingBuffName += m_Desc.Name;
        StagingBuffName += '\'';
        StagingBufferDesc.Name = StagingBuffName.c_str();

        StagingBufferDesc.Size           = GetStagingTextureDataSize(m_Desc, PBOOffsetAlignment);
        StagingBufferDesc.Usage          = USAGE_STAGING;
        StagingBufferDesc.CPUAccessFlags = TexDesc.CPUAccessFlags;

        pDeviceGL->CreateBuffer(StagingBufferDesc, nullptr, &m_pPBO);
        VERIFY_EXPR(m_pPBO);
    }
}